

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t exr_decoding_run(exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  long lVar1;
  int iVar2;
  exr_result_t eVar3;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_decode_pipeline_t *in_stack_00000010;
  exr_result_t rv;
  uint in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == 0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*(char **)(in_RDX + 0x10) == in_RDI) && (*(int *)(in_RDX + 0xc) == in_ESI)) {
        if (*(long *)(in_RDX + 0xd0) == 0) {
          local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Decode pipeline has no read_fn declared")
          ;
        }
        else {
          iVar2 = (**(code **)(in_RDX + 0xd0))(in_RDX);
          if (iVar2 == 0) {
            eVar3 = update_pack_unpack_ptrs
                              ((exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffd8);
            if (eVar3 == 0) {
              iVar2 = 0;
              if (*(long *)(in_RDX + 0xd8) != 0) {
                iVar2 = (**(code **)(in_RDX + 0xd8))(in_RDX);
              }
              if (iVar2 == 0) {
                local_4 = 0;
                if (((*(int *)(lVar1 + 4) != 2) && (*(int *)(lVar1 + 4) != 3)) ||
                   (local_4 = unpack_sample_table((_internal_exr_context *)decode,in_stack_00000010)
                   , (*(ushort *)(in_RDX + 10) & 4) == 0)) {
                  if (local_4 == 0) {
                    iVar2 = 0;
                    if (*(long *)(in_RDX + 0xe0) != 0) {
                      iVar2 = (**(code **)(in_RDX + 0xe0))(in_RDX);
                    }
                    if (iVar2 == 0) {
                      iVar2 = 0;
                      if (*(long *)(in_RDX + 0xe8) != 0) {
                        iVar2 = (**(code **)(in_RDX + 0xe8))(in_RDX);
                      }
                      if (iVar2 == 0) {
                        local_4 = 0;
                      }
                      else {
                        local_4 = (**(code **)(in_RDI + 0x40))
                                            (in_RDI,iVar2,
                                             "Decode pipeline unable to unpack and convert data");
                      }
                    }
                    else {
                      local_4 = (**(code **)(in_RDI + 0x40))
                                          (in_RDI,iVar2,
                                           "Decode pipeline unable to realloc deep sample table info"
                                          );
                    }
                  }
                  else {
                    local_4 = (**(code **)(in_RDI + 0x40))
                                        (in_RDI,local_4,
                                         "Decode pipeline unable to unpack deep sample table");
                  }
                }
              }
              else {
                local_4 = (**(code **)(in_RDI + 0x40))
                                    (in_RDI,iVar2,"Decode pipeline unable to decompress data");
              }
            }
            else {
              local_4 = (**(code **)(in_RDI + 0x40))
                                  (in_RDI,eVar3,
                                   "Decode pipeline unable to update pack / unpack pointers");
            }
          }
          else {
            local_4 = (**(code **)(in_RDI + 0x40))
                                (in_RDI,iVar2,"Unable to read pixel data block from context");
          }
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,
                             "Invalid request for decoding update from different context / part");
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_run (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);
    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    if (!decode->read_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Decode pipeline has no read_fn declared");
    rv = decode->read_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Unable to read pixel data block from context");

    if (rv == EXR_ERR_SUCCESS) rv = update_pack_unpack_ptrs (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to update pack / unpack pointers");

    if (rv == EXR_ERR_SUCCESS && decode->decompress_fn)
        rv = decode->decompress_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to decompress data");

    if (rv == EXR_ERR_SUCCESS &&
        (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED))
    {
        rv = unpack_sample_table (pctxt, decode);

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack deep sample table");

    if (rv == EXR_ERR_SUCCESS && decode->realloc_nonimage_data_fn)
        rv = decode->realloc_nonimage_data_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt,
            rv,
            "Decode pipeline unable to realloc deep sample table info");

    if (rv == EXR_ERR_SUCCESS && decode->unpack_and_convert_fn)
        rv = decode->unpack_and_convert_fn (decode);
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->report_error (
            pctxt, rv, "Decode pipeline unable to unpack and convert data");

    return rv;
}